

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O0

void __thiscall helics::Publication::publish(Publication *this,double *vals,int size)

{
  bool bVar1;
  int in_EDX;
  SmallBuffer *in_RSI;
  ValueFederate *in_RDI;
  SmallBuffer db;
  size_t in_stack_000000e8;
  undefined4 in_stack_000000f0;
  bool doPublish;
  SmallBuffer *this_00;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff10;
  SmallBuffer *in_stack_ffffffffffffff18;
  data_view *in_stack_ffffffffffffff20;
  Publication *in_stack_ffffffffffffff28;
  double *in_stack_ffffffffffffff38;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff40;
  SmallBuffer local_a8;
  byte local_15;
  int local_14;
  SmallBuffer *local_10;
  
  local_15 = *(long *)&in_RDI->field_0x38 != 0;
  if ((in_RDI->field_0x5c & 1) != 0) {
    local_14 = in_EDX;
    local_10 = in_RSI;
    bVar1 = changeDetected((defV *)in_stack_ffffffffffffff28,(double *)in_stack_ffffffffffffff20,
                           (size_t)in_stack_ffffffffffffff18,(double)in_stack_ffffffffffffff10);
    if (bVar1) {
      in_stack_ffffffffffffff20 =
           (data_view *)
           (&(((_Vector_impl *)(local_10->buffer)._M_elems)->super__Vector_impl_data)._M_start +
           local_14);
      in_stack_ffffffffffffff28 = (Publication *)&stack0xffffffffffffffcf;
      std::allocator<double>::allocator((allocator<double> *)0x2c3be6);
      std::vector<double,std::allocator<double>>::vector<double_const*,void>
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(double *)in_RDI,
                 (allocator_type *)in_stack_ffffffffffffff28);
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                   *)in_stack_ffffffffffffff20,(vector<double,_std::allocator<double>_> *)local_10);
      CLI::std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff10);
      CLI::std::allocator<double>::~allocator((allocator<double> *)&stack0xffffffffffffffcf);
      in_stack_ffffffffffffff18 = local_10;
    }
    else {
      local_15 = 0;
    }
  }
  if ((local_15 & 1) != 0) {
    this_00 = &local_a8;
    typeConvert(vals._4_4_,(double *)CONCAT44(size,in_stack_000000f0),in_stack_000000e8);
    data_view::data_view(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    helics::ValueFederate::publishBytes(in_RDI,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    data_view::~data_view((data_view *)0x2c3cdd);
    SmallBuffer::~SmallBuffer(this_00);
  }
  return;
}

Assistant:

void Publication::publish(const double* vals, int size)
{
    bool doPublish = (fed != nullptr);
    if (changeDetectionEnabled) {
        if (changeDetected(prevValue, vals, size, delta)) {
            prevValue = std::vector<double>(vals, vals + size);
        } else {
            doPublish = false;
        }
    }
    if (doPublish) {
        auto db = typeConvert(pubType, vals, size);
        fed->publishBytes(*this, db);
    }
}